

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_ccb0f7::ResizeRealtimeTest::PreEncodeFrameHook
          (ResizeRealtimeTest *this,VideoSource *video,Encoder *encoder)

{
  int iVar1;
  uint uVar2;
  aom_scaling_mode *in_RSI;
  aom_codec_enc_cfg_t *in_RDI;
  Encoder *unaff_retaddr;
  aom_scaling_mode mode_2;
  aom_scaling_mode mode_1;
  aom_scaling_mode mode;
  aom_codec_enc_cfg_t *cfg;
  
  cfg = in_RDI;
  iVar1 = (**(code **)((long)*in_RSI + 0x40))();
  if (iVar1 == 0) {
    libaom_test::Encoder::Control(unaff_retaddr,(int)((ulong)cfg >> 0x20),(int)cfg);
    libaom_test::Encoder::Control(unaff_retaddr,(int)((ulong)cfg >> 0x20),(int)cfg);
    libaom_test::Encoder::Control(unaff_retaddr,(int)((ulong)cfg >> 0x20),(int)cfg);
    libaom_test::Encoder::Control(unaff_retaddr,(int)((ulong)cfg >> 0x20),(int)cfg);
    libaom_test::Encoder::Control(unaff_retaddr,(int)((ulong)cfg >> 0x20),(int)cfg);
    libaom_test::Encoder::Control(unaff_retaddr,(int)((ulong)cfg >> 0x20),(int)cfg);
    if (in_RDI->g_pass != AOM_RC_ONE_PASS) {
      libaom_test::Encoder::Control(unaff_retaddr,(int)((ulong)cfg >> 0x20),(int)cfg);
      libaom_test::Encoder::Control(unaff_retaddr,(int)((ulong)cfg >> 0x20),(int)cfg);
      libaom_test::Encoder::Control(unaff_retaddr,(int)((ulong)cfg >> 0x20),(int)cfg);
    }
    if ((in_RDI[1].rc_buf_optimal_sz & 0x1000000) != 0) {
      libaom_test::Encoder::Control(unaff_retaddr,(int)((ulong)cfg >> 0x20),(int)cfg);
    }
  }
  if ((in_RDI[1].rc_buf_optimal_sz & 1) == 0) {
    if ((in_RDI[1].rc_buf_optimal_sz & 0x100) == 0) {
      if ((in_RDI[1].rc_buf_optimal_sz & 0x10000) != 0) {
        (**(code **)((long)*in_RSI + 0x40))();
        libaom_test::Encoder::Control(unaff_retaddr,(int)((ulong)cfg >> 0x20),in_RSI);
      }
    }
    else {
      uVar2 = (**(code **)((long)*in_RSI + 0x40))();
      if ((0x14 < uVar2) && (uVar2 = (**(code **)((long)*in_RSI + 0x40))(), 0x28 < uVar2)) {
        (**(code **)((long)*in_RSI + 0x40))();
      }
      libaom_test::Encoder::Control(unaff_retaddr,(int)((ulong)cfg >> 0x20),in_RSI);
    }
  }
  else {
    uVar2 = (**(code **)((long)*in_RSI + 0x40))();
    if ((0x14 < uVar2) && (uVar2 = (**(code **)((long)*in_RSI + 0x40))(), 0x28 < uVar2)) {
      (**(code **)((long)*in_RSI + 0x40))();
    }
    libaom_test::Encoder::Control(unaff_retaddr,(int)((ulong)cfg >> 0x20),in_RSI);
  }
  if (((in_RDI[1].rc_max_quantizer & 1) != 0) &&
     (uVar2 = (**(code **)((long)*in_RSI + 0x40))(), uVar2 == in_RDI[1].rc_undershoot_pct)) {
    *(undefined1 *)&in_RDI[1].rc_max_quantizer = 0;
    in_RDI->kf_mode = 500;
    libaom_test::Encoder::Config(unaff_retaddr,cfg);
  }
  return;
}

Assistant:

void PreEncodeFrameHook(libaom_test::VideoSource *video,
                          libaom_test::Encoder *encoder) override {
    if (video->frame() == 0) {
      encoder->Control(AV1E_SET_AQ_MODE, 3);
      encoder->Control(AV1E_SET_ALLOW_WARPED_MOTION, 0);
      encoder->Control(AV1E_SET_ENABLE_GLOBAL_MOTION, 0);
      encoder->Control(AV1E_SET_ENABLE_OBMC, 0);
      encoder->Control(AOME_SET_CPUUSED, set_cpu_used_);
      encoder->Control(AV1E_SET_FRAME_PARALLEL_DECODING, 1);
      if (cfg_.g_threads > 0) {
        encoder->Control(AV1E_SET_ROW_MT, 1);
        encoder->Control(AV1E_SET_TILE_COLUMNS, cfg_.g_threads >> 1);
        encoder->Control(AV1E_SET_TILE_ROWS, 0);
      }
      if (is_screen_)
        encoder->Control(AV1E_SET_TUNE_CONTENT, AOM_CONTENT_SCREEN);
    }
    if (set_scale_mode_) {
      struct aom_scaling_mode mode;
      if (video->frame() <= 20)
        mode = { AOME_ONETWO, AOME_ONETWO };
      else if (video->frame() <= 40)
        mode = { AOME_ONEFOUR, AOME_ONEFOUR };
      else if (video->frame() > 40)
        mode = { AOME_NORMAL, AOME_NORMAL };
      encoder->Control(AOME_SET_SCALEMODE, &mode);
    } else if (set_scale_mode2_) {
      struct aom_scaling_mode mode;
      if (video->frame() <= 20)
        mode = { AOME_ONEFOUR, AOME_ONEFOUR };
      else if (video->frame() <= 40)
        mode = { AOME_ONETWO, AOME_ONETWO };
      else if (video->frame() > 40)
        mode = { AOME_THREEFOUR, AOME_THREEFOUR };
      encoder->Control(AOME_SET_SCALEMODE, &mode);
    } else if (set_scale_mode3_) {
      struct aom_scaling_mode mode;
      if (video->frame() <= 30)
        mode = { AOME_ONETWO, AOME_NORMAL };
      else
        mode = { AOME_NORMAL, AOME_NORMAL };
      encoder->Control(AOME_SET_SCALEMODE, &mode);
    }

    if (change_bitrate_ && video->frame() == frame_change_bitrate_) {
      change_bitrate_ = false;
      cfg_.rc_target_bitrate = 500;
      encoder->Config(&cfg_);
    }
  }